

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O0

Vec_Wec_t * Vec_WecStart(int nSize)

{
  Vec_Wec_t *pVVar1;
  Vec_Wec_t *p;
  int nSize_local;
  
  pVVar1 = Vec_WecAlloc(nSize);
  pVVar1->nSize = nSize;
  return pVVar1;
}

Assistant:

static inline Vec_Wec_t * Vec_WecStart( int nSize )
{
    Vec_Wec_t * p;
    p = Vec_WecAlloc( nSize );
    p->nSize = nSize;
    return p;
}